

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvreader.cc
# Opt level: O0

int __thiscall mkvparser::MkvReader::Read(MkvReader *this,longlong offset,long len,uchar *buffer)

{
  size_t sVar1;
  void *in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  size_t size;
  undefined4 local_4;
  
  if (*(long *)(in_RDI + 0x10) == 0) {
    local_4 = -1;
  }
  else if (in_RSI < 0) {
    local_4 = -1;
  }
  else if ((long)in_RDX < 0) {
    local_4 = -1;
  }
  else if (in_RDX == 0) {
    local_4 = 0;
  }
  else if (in_RSI < *(long *)(in_RDI + 8)) {
    fseeko64(*(FILE **)(in_RDI + 0x10),in_RSI,0);
    sVar1 = fread(in_RCX,1,in_RDX,*(FILE **)(in_RDI + 0x10));
    if (sVar1 < in_RDX) {
      local_4 = -1;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int MkvReader::Read(long long offset, long len, unsigned char* buffer) {
  if (m_file == NULL)
    return -1;

  if (offset < 0)
    return -1;

  if (len < 0)
    return -1;

  if (len == 0)
    return 0;

  if (offset >= m_length)
    return -1;

#ifdef _MSC_VER
  const int status = _fseeki64(m_file, offset, SEEK_SET);

  if (status)
    return -1;  // error
#elif defined(_WIN32)
  fseeko64(m_file, static_cast<off_t>(offset), SEEK_SET);
#elif !(defined(__ANDROID__) && __ANDROID_API__ < 24 && !defined(__LP64__) && \
        defined(_FILE_OFFSET_BITS) && _FILE_OFFSET_BITS == 64)
  // POSIX.1 has fseeko and ftello. fseeko and ftello are not available before
  // Android API level 24. See
  // https://android.googlesource.com/platform/bionic/+/main/docs/32-bit-abi.md
  fseeko(m_file, static_cast<off_t>(offset), SEEK_SET);
#else
  fseek(m_file, static_cast<long>(offset), SEEK_SET);
#endif

  const size_t size = fread(buffer, 1, len, m_file);

  if (size < size_t(len))
    return -1;  // error

  return 0;  // success
}